

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_fee.cpp
# Opt level: O0

Amount __thiscall cfd::FeeCalculator::GetFee(FeeCalculator *this,Utxo *utxo)

{
  long in_RSI;
  undefined8 in_RDI;
  Amount AVar1;
  uint32_t vsize;
  uint32_t nowit_size;
  uint32_t minimum_txin;
  FeeCalculator *in_stack_fffffffffffffff0;
  
  core::AbstractTransaction::GetVsizeFromSize
            (*(ushort *)(in_RSI + 0x7a) + 0x29,(uint)*(ushort *)(in_RSI + 0x78));
  AVar1 = GetFee(in_stack_fffffffffffffff0,(uint32_t)((ulong)in_RDI >> 0x20));
  return AVar1;
}

Assistant:

Amount FeeCalculator::GetFee(const Utxo& utxo) const {
  uint32_t minimum_txin = static_cast<uint32_t>(TxIn::kMinimumTxInSize);
  uint32_t nowit_size = minimum_txin + utxo.uscript_size_max;
  uint32_t vsize =
      AbstractTransaction::GetVsizeFromSize(nowit_size, utxo.witness_size_max);
  return GetFee(vsize);
}